

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>::
AdapterPromiseNode<kj::TimerImpl::Impl&,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>
          (AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter> *this,Impl *params,
          Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *params_1)

{
  iterator iVar1;
  TimerPromiseAdapter *local_18;
  
  *(undefined8 *)(this + 8) = 0;
  *(undefined ***)this = &PTR_onReady_0062db88;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_0062dbd0;
  this[0x18] = (AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>)0x0;
  this[0x178] = (AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>)0x0;
  this[0x180] = (AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>)0x1;
  local_18 = (TimerPromiseAdapter *)(this + 0x188);
  *(long *)(this + 0x188) = (params_1->value).value;
  *(AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter> **)(this + 400) = this + 0x10
  ;
  *(Impl **)(this + 0x198) = params;
  *(undefined8 *)(this + 0x1a0) = 0;
  iVar1 = std::
          _Rb_tree<kj::TimerImpl::TimerPromiseAdapter*,kj::TimerImpl::TimerPromiseAdapter*,std::_Identity<kj::TimerImpl::TimerPromiseAdapter*>,kj::TimerImpl::Impl::TimerBefore,std::allocator<kj::TimerImpl::TimerPromiseAdapter*>>
          ::_M_insert_equal<kj::TimerImpl::TimerPromiseAdapter*>
                    ((_Rb_tree<kj::TimerImpl::TimerPromiseAdapter*,kj::TimerImpl::TimerPromiseAdapter*,std::_Identity<kj::TimerImpl::TimerPromiseAdapter*>,kj::TimerImpl::Impl::TimerBefore,std::allocator<kj::TimerImpl::TimerPromiseAdapter*>>
                      *)params,&local_18);
  *(_Base_ptr *)(this + 0x1a0) = iVar1._M_node;
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}